

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O3

wchar_t spell_collect_from_book(player *p,object *obj,int **spells)

{
  uint uVar1;
  class_book *pcVar2;
  long lVar3;
  int *piVar4;
  int *piVar5;
  ulong uVar6;
  long lVar7;
  
  lVar3 = (long)(p->class->magic).num_books;
  if (0 < lVar3) {
    pcVar2 = (p->class->magic).books;
    lVar7 = 0;
    do {
      if ((*(uint *)((long)&pcVar2->tval + lVar7) == (uint)obj->tval) &&
         (*(uint *)((long)&pcVar2->sval + lVar7) == (uint)obj->sval)) {
        uVar1 = *(uint *)((long)&pcVar2->num_spells + lVar7);
        uVar6 = 0;
        if (0 < (int)uVar1) {
          uVar6 = (ulong)uVar1;
        }
        piVar4 = (int *)mem_zalloc(uVar6 * 8);
        *spells = piVar4;
        if (0 < *(int *)((long)&pcVar2->num_spells + lVar7)) {
          piVar5 = (int *)(*(long *)((long)&pcVar2->spells + lVar7) + 0x20);
          lVar3 = 0;
          do {
            piVar4[lVar3] = *piVar5;
            lVar3 = lVar3 + 1;
            piVar5 = piVar5 + 0xe;
          } while (lVar3 < *(int *)((long)&pcVar2->num_spells + lVar7));
        }
        goto LAB_001a848b;
      }
      lVar7 = lVar7 + 0x20;
    } while (lVar3 * 0x20 != lVar7);
  }
  uVar6 = 0;
LAB_001a848b:
  return (wchar_t)uVar6;
}

Assistant:

int spell_collect_from_book(const struct player *p, const struct object *obj,
		int **spells)
{
	const struct class_book *book = player_object_to_book(p, obj);
	int i, n_spells = 0;

	if (!book) {
		return n_spells;
	}

	/* Count the spells */
	for (i = 0; i < book->num_spells; i++)
		n_spells++;

	/* Allocate the array */
	*spells = mem_zalloc(n_spells * sizeof(*spells));

	/* Write the spells */
	for (i = 0; i < book->num_spells; i++)
		(*spells)[i] = book->spells[i].sidx;

	return n_spells;
}